

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O1

void __thiscall
StringWriter_ReadMaxTwoByteLengthCharString_Test::TestBody
          (StringWriter_ReadMaxTwoByteLengthCharString_Test *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  pointer *ppuVar1;
  iterator __position;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *extraout_RDX;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *extraout_RDX_00;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *archive_00;
  pointer *__ptr;
  char *pcVar2;
  long lVar3;
  AssertionResult gtest_ar;
  string actual;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  archive;
  string expected;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  out = &(this->super_StringWriter).bytes_;
  pstore::varint::
  encode<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (0x3fff,(back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     )out);
  lVar3 = -0x3fff;
  archive_00 = extraout_RDX;
  do {
    local_68._M_dataplus._M_p._0_1_ = 0x61;
    __position._M_current =
         (this->super_StringWriter).bytes_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_StringWriter).bytes_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (out,__position,(uchar *)&local_68);
      archive_00 = extraout_RDX_00;
    }
    else {
      *__position._M_current = 'a';
      ppuVar1 = &(this->super_StringWriter).bytes_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  local_48 = (((this->super_StringWriter).writer_.
               super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.policy_.
              bytes_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  pstore::serialize::
  read<std::__cxx11::string,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
            (&local_68,(serialize *)&local_48,archive_00);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_40,-1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_78,"expected","actual",&local_40,&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_88._M_current != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_current + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_current =
       (((this->super_StringWriter).writer_.
         super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.policy_.bytes_
        )->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_80._M_current = local_48;
  testing::internal::
  CmpHelperEQ<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_78,"std::end (writer_)","archive.iterator ()",&local_88,&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)local_88._M_current != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_current + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_) !=
      &local_68.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_),
                    local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F (StringWriter, ReadMaxTwoByteLengthCharString) {
    auto const src_length = three_byte_varint - 1;
    auto const src_char = 'a';

    // Produce a serialized string of 'length' character 'a's.
    {
        auto output_it = std::back_inserter (bytes_);
        pstore::varint::encode (src_length, output_it);
        std::generate_n (output_it, src_length,
                         [src_char] () { return static_cast<std::uint8_t> (src_char); });
    }

    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    std::string const actual = pstore::serialize::read<std::string> (archive);
    std::string const expected (src_length, src_char);
    EXPECT_EQ (expected, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}